

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_value(basic_bson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
          json_visitor *visitor,uint8_t type,error_code *ec)

{
  size_t *psVar1;
  stream_source<unsigned_char> *this_00;
  string_type *buffer;
  char *first;
  pointer ppVar2;
  pointer puVar3;
  int iVar4;
  bson_errc __e;
  byte bVar5;
  ssize_t sVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar7;
  _func_int **pp_Var8;
  undefined7 in_register_00000011;
  size_t length;
  size_t length_00;
  undefined8 uVar9;
  int __fd;
  oid_t *poVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v;
  type tVar11;
  decimal128_to_chars_result dVar12;
  undefined8 uStack_70;
  uint8_t buf [8];
  uint8_t subtype;
  uint8_t uStack_57;
  uint8_t uStack_56;
  uint8_t uStack_55;
  uint8_t uStack_54;
  uint8_t uStack_53;
  uint8_t uStack_52;
  uint8_t uStack_51;
  undefined4 uStack_50;
  oid_t oid;
  undefined4 uStack_34;
  
  poVar10 = (oid_t *)buf;
  iVar4 = (int)CONCAT71(in_register_00000011,type);
  __fd = (int)buf;
  switch(iVar4) {
  case 1:
    sVar6 = stream_source<unsigned_char>::read(&this->source_,__fd,(void *)0x8,0x6567a8);
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar6;
    if (sVar6 == 8) {
      (*visitor->_vptr_basic_json_visitor[0x12])(buf._0_4_,visitor,0,this,ec);
LAB_001b2f6f:
      bVar5 = this->cursor_mode_ ^ 1;
      goto LAB_001b2f74;
    }
    break;
  case 3:
    begin_document(this,visitor,ec);
    return;
  case 4:
    begin_array(this,visitor,ec);
    return;
  case 5:
    this_00 = &this->source_;
    sVar6 = stream_source<unsigned_char>::read(this_00,__fd,(void *)0x4,0x6567a8);
    ppVar2 = (this->state_stack_).
             super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar1 = &ppVar2[-1].pos;
    *psVar1 = *psVar1 + sVar6;
    if (sVar6 != 4) {
      __e = unexpected_eof;
      goto LAB_001b2b38;
    }
    v = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(long)(int)buf._0_4_;
    if ((long)v < 0) {
      __e = length_is_negative;
      goto LAB_001b2b38;
    }
    sVar6 = stream_source<unsigned_char>::read(this_00,(int)&subtype,(void *)0x1,(size_t)ppVar2);
    ppVar2 = (this->state_stack_).
             super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar1 = &ppVar2[-1].pos;
    *psVar1 = *psVar1 + sVar6;
    if (sVar6 == 1) {
      puVar3 = (this->bytes_buffer_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar3) {
        (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar3;
      }
      pvVar7 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               source_reader<jsoncons::stream_source<unsigned_char>>::
               read<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ((source_reader<jsoncons::stream_source<unsigned_char>> *)this_00,
                          (stream_source<unsigned_char> *)&this->bytes_buffer_,v,(size_t)ppVar2);
      psVar1 = &(this->state_stack_).
                super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
      *psVar1 = (long)&(pvVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start + *psVar1;
      if (pvVar7 == v) {
        basic_json_visitor<char>::
        byte_string_value<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (visitor,&this->bytes_buffer_,(ulong)_subtype & 0xff,&this->super_ser_context,ec,0
                  );
        goto LAB_001b2f6f;
      }
    }
    break;
  case 6:
    pp_Var8 = visitor->_vptr_basic_json_visitor;
    uVar9 = 0xd;
    goto LAB_001b2eed;
  case 7:
    sVar6 = stream_source<unsigned_char>::read(&this->source_,(int)&subtype,(void *)0xc,0x6567a8);
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar6;
    if (sVar6 == 0xc) {
      stack0xffffffffffffffc8 = (pointer)CONCAT44(uStack_34,uStack_50);
      oid.bytes_._M_elems[0] = subtype;
      oid.bytes_._M_elems[1] = uStack_57;
      oid.bytes_._M_elems[2] = uStack_56;
      oid.bytes_._M_elems[3] = uStack_55;
      oid.bytes_._M_elems[4] = uStack_54;
      oid.bytes_._M_elems[5] = uStack_53;
      oid.bytes_._M_elems[6] = uStack_52;
      oid.bytes_._M_elems[7] = uStack_51;
      to_string<std::__cxx11::string>(&oid,&this->text_buffer_);
      buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
      pp_Var8 = visitor->_vptr_basic_json_visitor;
      uStack_70 = 0x13;
LAB_001b2e84:
      (*pp_Var8[0xc])(visitor,poVar10,uStack_70,this,ec);
      goto LAB_001b2f6f;
    }
    break;
  case 8:
    sVar6 = stream_source<unsigned_char>::read(&this->source_,__fd,(void *)0x1,0x6567a8);
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar6;
    if (sVar6 == 1) {
      (*visitor->_vptr_basic_json_visitor[0xb])(visitor,(ulong)(buf[0] != '\0'),0,this,ec);
      goto LAB_001b2f6f;
    }
    break;
  case 9:
    sVar6 = stream_source<unsigned_char>::read(&this->source_,__fd,(void *)0x8,0x6567a8);
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar6;
    if (sVar6 == 8) {
      pp_Var8 = visitor->_vptr_basic_json_visitor;
      uVar9 = 6;
LAB_001b2f2c:
      (*pp_Var8[0x10])(visitor,buf,uVar9,this,ec);
      goto LAB_001b2f6f;
    }
    break;
  case 10:
    pp_Var8 = visitor->_vptr_basic_json_visitor;
    uVar9 = 0;
LAB_001b2eed:
    (*pp_Var8[10])(visitor,uVar9,this,ec);
    goto LAB_001b2ef6;
  case 0xb:
    (this->text_buffer_)._M_string_length = 0;
    buffer = &this->text_buffer_;
    *(this->text_buffer_)._M_dataplus._M_p = '\0';
    std::__cxx11::string::push_back((char)buffer);
    read_cstring(this,buffer,ec);
    if (ec->_M_value != 0) {
      return;
    }
    std::__cxx11::string::push_back((char)buffer);
    read_cstring(this,buffer,ec);
    if (ec->_M_value != 0) {
      return;
    }
    buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
    pp_Var8 = visitor->_vptr_basic_json_visitor;
    uStack_70 = 0x14;
    goto LAB_001b2d40;
  case 0xc:
  case 0xf:
switchD_001b2a77_caseD_c:
    __e = unknown_type;
    goto LAB_001b2b38;
  case 0xd:
    (this->text_buffer_)._M_string_length = 0;
    *(this->text_buffer_)._M_dataplus._M_p = '\0';
    read_string(this,&this->text_buffer_,ec);
    if (ec->_M_value != 0) {
      return;
    }
    tVar11 = unicode_traits::validate<char>
                       ((unicode_traits *)(this->text_buffer_)._M_dataplus._M_p,
                        (char *)(this->text_buffer_)._M_string_length,length_00);
    if (tVar11.ec == success) {
      buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
      pp_Var8 = visitor->_vptr_basic_json_visitor;
      uStack_70 = 0x15;
      goto LAB_001b2d40;
    }
    goto LAB_001b2f95;
  case 0x10:
    sVar6 = stream_source<unsigned_char>::read(&this->source_,__fd,(void *)0x4,0x6567a8);
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar6;
    if (sVar6 == 4) {
      buf = (uint8_t  [8])(long)(int)buf._0_4_;
LAB_001b2f24:
      pp_Var8 = visitor->_vptr_basic_json_visitor;
      uVar9 = 0;
      goto LAB_001b2f2c;
    }
    break;
  case 0x11:
    sVar6 = stream_source<unsigned_char>::read(&this->source_,__fd,(void *)0x8,0x6567a8);
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar6;
    if (sVar6 == 8) {
      (*visitor->_vptr_basic_json_visitor[0xf])(visitor,buf,0,this,ec);
      goto LAB_001b2f6f;
    }
    break;
  case 0x12:
    sVar6 = stream_source<unsigned_char>::read(&this->source_,__fd,(void *)0x8,0x6567a8);
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar6;
    if (sVar6 == 8) goto LAB_001b2f24;
    break;
  case 0x13:
    sVar6 = stream_source<unsigned_char>::read(&this->source_,__fd,&DAT_00000010,0x6567a8);
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar6;
    if (sVar6 == 0x10) {
      subtype = buf[0];
      uStack_57 = buf[1];
      uStack_56 = buf[2];
      uStack_55 = buf[3];
      uStack_54 = buf[4];
      uStack_53 = buf[5];
      uStack_52 = buf[6];
      uStack_51 = buf[7];
      (this->text_buffer_)._M_string_length = 0;
      *(this->text_buffer_)._M_dataplus._M_p = '\0';
      std::__cxx11::string::resize((ulong)&this->text_buffer_);
      first = (this->text_buffer_)._M_dataplus._M_p;
      dVar12 = decimal128_to_chars(first,first + (this->text_buffer_)._M_string_length,
                                   (decimal128_t *)&subtype);
      unique0x00012000 = (this->text_buffer_)._M_dataplus._M_p;
      oid.bytes_._M_elems._0_8_ = (long)dVar12.ptr - (long)unique0x00012000;
      poVar10 = &oid;
      pp_Var8 = visitor->_vptr_basic_json_visitor;
      uStack_70 = 0xb;
      goto LAB_001b2e84;
    }
    break;
  default:
    if ((iVar4 != 0x7f) && (iVar4 != 0xff)) goto switchD_001b2a77_caseD_c;
  case 2:
  case 0xe:
    (this->text_buffer_)._M_string_length = 0;
    *(this->text_buffer_)._M_dataplus._M_p = '\0';
    read_string(this,&this->text_buffer_,ec);
    if (ec->_M_value != 0) {
      return;
    }
    tVar11 = unicode_traits::validate<char>
                       ((unicode_traits *)(this->text_buffer_)._M_dataplus._M_p,
                        (char *)(this->text_buffer_)._M_string_length,length);
    if (tVar11.ec != success) {
LAB_001b2f95:
      __e = invalid_utf8_text_string;
LAB_001b2b38:
      std::error_code::operator=(ec,__e);
      this->more_ = false;
      return;
    }
    buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
    pp_Var8 = visitor->_vptr_basic_json_visitor;
    uStack_70 = 0;
LAB_001b2d40:
    (*pp_Var8[0xc])(visitor,buf,uStack_70,this,ec);
LAB_001b2ef6:
    this->more_ = (bool)(this->cursor_mode_ ^ 1);
    return;
  }
  std::error_code::operator=(ec,unexpected_eof);
  bVar5 = false;
LAB_001b2f74:
  this->more_ = (bool)bVar5;
  return;
}

Assistant:

void read_value(json_visitor& visitor, uint8_t type, std::error_code& ec)
    {
        switch (type)
        {
            case jsoncons::bson::bson_type::double_type:
            {
                uint8_t buf[sizeof(double)]; 
                std::size_t n = source_.read(buf, sizeof(double));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(double)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                double res = binary::little_to_native<double>(buf, sizeof(buf));
                visitor.double_value(res, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::symbol_type:
            case jsoncons::bson::bson_type::min_key_type:
            case jsoncons::bson::bson_type::max_key_type:
            case jsoncons::bson::bson_type::string_type:
            {
                text_buffer_.clear();
                read_string(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                auto result = unicode_traits::validate(text_buffer_.data(), text_buffer_.size());
                if (JSONCONS_UNLIKELY(result.ec != unicode_traits::conv_errc()))
                {
                    ec = bson_errc::invalid_utf8_text_string;
                    more_ = false;
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::javascript_type:
            {
                text_buffer_.clear();
                read_string(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                auto result = unicode_traits::validate(text_buffer_.data(), text_buffer_.size());
                if (JSONCONS_UNLIKELY(result.ec != unicode_traits::conv_errc()))
                {
                    ec = bson_errc::invalid_utf8_text_string;
                    more_ = false;
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::code, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::regex_type:
            {
                text_buffer_.clear();
                text_buffer_.push_back('/');
                read_cstring(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                text_buffer_.push_back('/');
                read_cstring(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::regex, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::document_type: 
            {
                begin_document(visitor,ec);
                break;
            }

            case jsoncons::bson::bson_type::array_type: 
            {
                begin_array(visitor,ec);
                break;
            }
            case jsoncons::bson::bson_type::undefined_type: 
                {
                    visitor.null_value(semantic_tag::undefined, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
            case jsoncons::bson::bson_type::null_type: 
            {
                visitor.null_value(semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::bool_type:
            {
                uint8_t c;
                std::size_t n = source_.read(&c, 1);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != 1))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                visitor.bool_value(c != 0, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::int32_type: 
            {
                uint8_t buf[sizeof(int32_t)]; 
                std::size_t n = source_.read(buf, sizeof(int32_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int32_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::timestamp_type: 
            {
                uint8_t buf[sizeof(uint64_t)]; 
                std::size_t n = source_.read(buf, sizeof(uint64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(uint64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<uint64_t>(buf, sizeof(buf));
                visitor.uint64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::int64_type: 
            {
                uint8_t buf[sizeof(int64_t)]; 
                std::size_t n = source_.read(buf, sizeof(int64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int64_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::datetime_type: 
            {
                uint8_t buf[sizeof(int64_t)]; 
                std::size_t n = source_.read(buf, sizeof(int64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int64_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::epoch_milli, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::binary_type: 
            {
                uint8_t buf[sizeof(int32_t)]; 
                std::size_t n = source_.read(buf, sizeof(int32_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                const auto len = binary::little_to_native<int32_t>(buf, sizeof(buf));
                if (JSONCONS_UNLIKELY(len < 0))
                {
                    ec = bson_errc::length_is_negative;
                    more_ = false;
                    return;
                }
                uint8_t subtype;
                n = source_.read(&subtype, 1);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != 1))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                bytes_buffer_.clear();
                n = source_reader<Source>::read(source_, bytes_buffer_, len);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != static_cast<std::size_t>(len)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                visitor.byte_string_value(bytes_buffer_, 
                                                  subtype, 
                                                  *this,
                                                  ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::decimal128_type: 
            {
                uint8_t buf[sizeof(uint64_t)*2]; 
                std::size_t n = source_.read(buf, sizeof(buf));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(buf)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                decimal128_t dec;
                dec.low = binary::little_to_native<uint64_t>(buf, sizeof(uint64_t));
                dec.high = binary::little_to_native<uint64_t>(buf+sizeof(uint64_t), sizeof(uint64_t));

                text_buffer_.clear();
                text_buffer_.resize(bson::decimal128_limits::buf_size);
                auto r = bson::decimal128_to_chars(&text_buffer_[0], &text_buffer_[0]+text_buffer_.size(), dec);
                visitor.string_value(string_view(text_buffer_.data(),static_cast<std::size_t>(r.ptr-text_buffer_.data())), semantic_tag::float128, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::object_id_type: 
            {
                uint8_t buf[12]; 
                std::size_t n = source_.read(buf, sizeof(buf));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(buf)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                oid_t oid(buf);
                to_string(oid, text_buffer_);

                visitor.string_value(text_buffer_, semantic_tag::id, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            default:
            {
                ec = bson_errc::unknown_type;
                more_ = false;
                return;
            }
        }
    }